

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_PREDpp_2021.h
# Opt level: O0

void __thiscall PREDpp<UFPC>::PerformLabeling(PREDpp<UFPC> *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uchar *puVar5;
  uint *puVar6;
  uint *puVar7;
  uchar *puVar8;
  uint *e;
  uint *b;
  int r_i;
  uint *img_labels_row11;
  uint *img_labels_row00_1;
  uchar *img_row11;
  uchar *img_row00_1;
  int c_1;
  int r;
  uint *img_labels_row00;
  uchar *img_row00;
  int c;
  int h;
  int w;
  int local_7c;
  Size local_78;
  Mat_<int> local_70;
  PREDpp<UFPC> *local_10;
  PREDpp<UFPC> *this_local;
  
  local_10 = this;
  cv::MatSize::operator()((MatSize *)&local_78);
  local_7c = 0;
  cv::Mat_<int>::Mat_(&local_70,&local_78,&local_7c);
  cv::Mat_<int>::operator=((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_,&local_70)
  ;
  cv::Mat_<int>::~Mat_(&local_70);
  UFPC::Alloc(((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8 + 1) /
              2) * ((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc +
                    1) / 2) + 1);
  UFPC::Setup();
  iVar1 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
  iVar2 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  img_row00._0_4_ = -1;
  puVar5 = cv::Mat::ptr<unsigned_char>
                     (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,0);
  puVar6 = cv::Mat::ptr<unsigned_int>
                     (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,0
                     );
  iVar3 = (int)img_row00;
  while (img_row00._0_4_ = iVar3, iVar3 = (int)img_row00 + 1, iVar3 < iVar1 + -1) {
    if (puVar5[iVar3] != '\0') {
      uVar4 = UFPC::NewLabel();
      puVar6[iVar3] = uVar4;
      img_row00._0_4_ = iVar3;
      while( true ) {
        iVar3 = (int)img_row00 + 1;
        if (iVar1 + -1 <= iVar3) {
          if (puVar5[iVar3] != '\0') {
            puVar6[iVar3] = puVar6[(int)img_row00];
          }
          goto LAB_002e16ac;
        }
        if (puVar5[iVar3] == '\0') break;
        puVar6[iVar3] = puVar6[(int)img_row00];
        img_row00._0_4_ = iVar3;
      }
    }
  }
  if (puVar5[iVar3] != '\0') {
    uVar4 = UFPC::NewLabel();
    puVar6[iVar3] = uVar4;
  }
LAB_002e16ac:
  img_row00_1._4_4_ = 1;
  do {
    if (iVar2 <= img_row00_1._4_4_) {
      uVar4 = UFPC::Flatten();
      (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar4;
      for (b._4_4_ = 0;
          b._4_4_ < *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                             field_0x8; b._4_4_ = b._4_4_ + 1) {
        e = cv::Mat::ptr<unsigned_int>
                      (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                       b._4_4_);
        puVar6 = e + *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                              field_0xc;
        for (; e != puVar6; e = e + 1) {
          uVar4 = UFPC::GetLabel(*e);
          *e = uVar4;
        }
      }
      UFPC::Dealloc();
      return;
    }
    puVar5 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                        img_row00_1._4_4_);
    puVar8 = puVar5 + -**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->
                                   field_0x48;
    puVar6 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,img_row00_1._4_4_);
    puVar7 = (uint *)((long)puVar6 -
                     **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                                 field_0x48);
    img_row00_1._0_4_ = 0;
    if (iVar1 + -1 < 1) {
      if (*puVar5 != '\0') {
        if (*puVar8 == '\0') {
          uVar4 = UFPC::NewLabel();
          *puVar6 = uVar4;
        }
        else {
          *puVar6 = *puVar7;
        }
      }
    }
    else {
      iVar3 = (int)img_row00_1;
      if (*puVar5 == '\0') goto LAB_002e1831;
      if (*puVar8 == '\0') {
        if (puVar8[1] == '\0') {
          uVar4 = UFPC::NewLabel();
          *puVar6 = uVar4;
          goto LAB_002e19c0;
        }
        *puVar6 = puVar7[1];
        goto LAB_002e1a91;
      }
      *puVar6 = *puVar7;
      img_row00_1._0_4_ = 0;
LAB_002e1af2:
      iVar3 = (int)img_row00_1 + 1;
      if (iVar3 < iVar1 + -1) {
        if (puVar5[iVar3] == '\0') goto LAB_002e1831;
        img_row00_1._0_4_ = iVar3;
        if (puVar8[iVar3] == '\0') {
LAB_002e19fe:
          if (puVar8[(int)img_row00_1 + 1] == '\0') {
            puVar6[(int)img_row00_1] = puVar6[(int)img_row00_1 + -1];
            goto LAB_002e19c0;
          }
          uVar4 = UFPC::Merge(puVar6[(int)img_row00_1 + -1],puVar7[(int)img_row00_1 + 1]);
          puVar6[(int)img_row00_1] = uVar4;
LAB_002e1a91:
          while( true ) {
            iVar3 = (int)img_row00_1 + 1;
            if (iVar1 + -1 <= iVar3) {
              if (puVar5[iVar3] != '\0') {
                puVar6[iVar3] = puVar7[iVar3];
              }
              goto LAB_002e1da5;
            }
            if (puVar5[iVar3] != '\0') break;
LAB_002e1831:
            while( true ) {
              do {
                img_row00_1._0_4_ = iVar3;
                iVar3 = (int)img_row00_1 + 1;
                if (iVar1 + -1 <= iVar3) {
                  if (puVar5[iVar3] != '\0') {
                    if (puVar8[iVar3] == '\0') {
                      if (puVar8[(int)img_row00_1] == '\0') {
                        uVar4 = UFPC::NewLabel();
                        puVar6[iVar3] = uVar4;
                      }
                      else {
                        puVar6[iVar3] = puVar7[(int)img_row00_1];
                      }
                    }
                    else {
                      puVar6[iVar3] = puVar7[iVar3];
                    }
                  }
                  goto LAB_002e1da5;
                }
              } while (puVar5[iVar3] == '\0');
              if (puVar8[iVar3] != '\0') {
                puVar6[iVar3] = puVar7[iVar3];
                img_row00_1._0_4_ = iVar3;
                goto LAB_002e1af2;
              }
              if (puVar8[(int)img_row00_1 + 2] != '\0') break;
              if (puVar8[(int)img_row00_1] == '\0') {
                uVar4 = UFPC::NewLabel();
                puVar6[iVar3] = uVar4;
                img_row00_1._0_4_ = iVar3;
              }
              else {
                puVar6[iVar3] = puVar7[(int)img_row00_1];
                img_row00_1._0_4_ = iVar3;
              }
LAB_002e19c0:
              iVar3 = (int)img_row00_1 + 1;
              if (iVar1 + -1 <= iVar3) {
                if (puVar5[iVar3] != '\0') {
                  puVar6[iVar3] = puVar6[(int)img_row00_1];
                }
                goto LAB_002e1da5;
              }
              img_row00_1._0_4_ = iVar3;
              if (puVar5[iVar3] != '\0') goto LAB_002e19fe;
            }
            if (puVar8[(int)img_row00_1] == '\0') {
              puVar6[iVar3] = puVar7[(int)img_row00_1 + 2];
              img_row00_1._0_4_ = iVar3;
            }
            else {
              uVar4 = UFPC::Merge(puVar7[(int)img_row00_1 + 2],puVar7[(int)img_row00_1]);
              puVar6[iVar3] = uVar4;
              img_row00_1._0_4_ = iVar3;
            }
          }
          puVar6[iVar3] = puVar7[iVar3];
          img_row00_1._0_4_ = iVar3;
        }
        else {
          puVar6[iVar3] = puVar7[iVar3];
        }
        goto LAB_002e1af2;
      }
      if (puVar5[iVar3] != '\0') {
        if (puVar8[iVar3] == '\0') {
          puVar6[iVar3] = puVar6[(int)img_row00_1];
        }
        else {
          puVar6[iVar3] = puVar7[iVar3];
        }
      }
    }
LAB_002e1da5:
    img_row00_1._4_4_ = img_row00_1._4_4_ + 1;
  } while( true );
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size(), 0); // Call to memset

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();

        // Rosenfeld Mask
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First Scan
        int w(img_.cols);
        int h(img_.rows);

        //Conditions:
#define CONDITION_P img_row11[c - 1] > 0
#define CONDITION_Q img_row11[c] > 0
#define CONDITION_R img_row11[c + 1] > 0
#define CONDITION_S img_row00[c - 1] > 0
#define CONDITION_X img_row00[c] > 0


//Actions:
// Action 1: nothing
#define ACTION_1 
// Action 2: x<-newlabel
#define ACTION_2 img_labels_row00[c] = LabelsSolver::NewLabel();
// Action 3: x<-p
#define ACTION_3 img_labels_row00[c] = img_labels_row11[c - 1];
// Action 4: x<-q
#define ACTION_4 img_labels_row00[c] = img_labels_row11[c];
// Action 5: x<-r
#define ACTION_5 img_labels_row00[c] = img_labels_row11[c + 1];
// Action 6: x<-p+r
#define ACTION_6 img_labels_row00[c] = LabelsSolver::Merge(img_labels_row11[c + 1], img_labels_row11[c - 1]);
// Action 7: x<-s
#define ACTION_7 img_labels_row00[c] = img_labels_row00[c - 1];
// Action 8: x<-r+s
#define ACTION_8 img_labels_row00[c] = LabelsSolver::Merge(img_labels_row00[c - 1], img_labels_row11[c + 1]);


#define COLS w

        {
            int c = -1;

            const unsigned char* const img_row00 = img_.ptr<unsigned char>(0);

            // Row pointers for the output image 
            unsigned* const img_labels_row00 = img_labels_.ptr<unsigned>(0);
            goto fl_tree_0;
#include "labeling_PREDpp_2021_fl_forest.inc.h"
        }

        for (int r = 1; r < h; ++r) {
            int c = -1;
            // Get rows pointer
    // Row pointers for the input image 
            const unsigned char* const img_row00 = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row11 = (unsigned char *)(((char *)img_row00) + img_.step.p[0] * -1);

            // Row pointers for the output image 
            unsigned* const img_labels_row00 = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row11 = (unsigned *)(((char *)img_labels_row00) + img_labels_.step.p[0] * -1);
            goto cl_tree_0;
#include "labeling_PREDpp_2021_cl_forest.inc.h"

        }//End rows's for

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_X
#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R

    // Second scan
        n_labels_ = LabelsSolver::Flatten();

        for (int r_i = 0; r_i < img_labels_.rows; ++r_i) {
            unsigned int *b = img_labels_.ptr<unsigned int>(r_i);
            unsigned int *e = b + img_labels_.cols;
            for (; b != e; ++b) {
                *b = LabelsSolver::GetLabel(*b);
            }
        }

        LabelsSolver::Dealloc();
    }